

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient2dexact(double *pa,double *pb,double *pc)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double w [12];
  double v [8];
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double adStack_c0 [13];
  double local_58 [9];
  
  dVar11 = *pa;
  dVar12 = dVar11 * splitter - (dVar11 * splitter - dVar11);
  dVar8 = dVar11 - dVar12;
  dVar7 = pc[1];
  dVar3 = pb[1];
  dVar10 = dVar11 * dVar3;
  dVar11 = dVar11 * dVar7;
  dVar5 = splitter * dVar3 - (splitter * dVar3 - dVar3);
  dVar6 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar2 = dVar3 - dVar5;
  dVar4 = dVar7 - dVar6;
  dVar9 = dVar8 * dVar2 - (((dVar10 - dVar12 * dVar5) - dVar8 * dVar5) - dVar12 * dVar2);
  dVar8 = dVar8 * dVar4 - (((dVar11 - dVar12 * dVar6) - dVar8 * dVar6) - dVar12 * dVar4);
  dVar14 = dVar9 - dVar8;
  dVar13 = dVar10 + dVar14;
  dVar10 = (dVar10 - (dVar13 - (dVar13 - dVar10))) + (dVar14 - (dVar13 - dVar10));
  dVar12 = dVar10 - dVar11;
  local_d8 = (dVar9 - (dVar14 + (dVar9 - dVar14))) + ((dVar9 - dVar14) - dVar8);
  dStack_d0 = (dVar10 - (dVar12 + (dVar10 - dVar12))) + ((dVar10 - dVar12) - dVar11);
  adStack_c0[0] = dVar13 + dVar12;
  local_c8 = (dVar13 - (adStack_c0[0] - (adStack_c0[0] - dVar13))) +
             (dVar12 - (adStack_c0[0] - dVar13));
  dVar11 = *pb;
  dVar12 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar14 = dVar11 - dVar12;
  dVar8 = pa[1];
  dVar10 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar9 = dVar8 - dVar10;
  dVar7 = dVar7 * dVar11;
  dVar11 = dVar8 * dVar11;
  dVar13 = dVar4 * dVar14 - (((dVar7 - dVar12 * dVar6) - dVar6 * dVar14) - dVar12 * dVar4);
  dVar12 = dVar9 * dVar14 - (((dVar11 - dVar12 * dVar10) - dVar10 * dVar14) - dVar12 * dVar9);
  dVar14 = dVar13 - dVar12;
  dVar6 = dVar7 + dVar14;
  dVar7 = (dVar7 - (dVar6 - (dVar6 - dVar7))) + (dVar14 - (dVar6 - dVar7));
  dVar4 = dVar7 - dVar11;
  local_f8 = (dVar13 - (dVar14 + (dVar13 - dVar14))) + ((dVar13 - dVar14) - dVar12);
  dStack_f0 = (dVar7 - (dVar4 + (dVar7 - dVar4))) + ((dVar7 - dVar4) - dVar11);
  dStack_e0 = dVar6 + dVar4;
  local_e8 = (dVar6 - (dStack_e0 - (dStack_e0 - dVar6))) + (dVar4 - (dStack_e0 - dVar6));
  dVar11 = *pc;
  dVar7 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar6 = dVar11 - dVar7;
  dVar8 = dVar11 * dVar8;
  dVar11 = dVar11 * dVar3;
  dVar4 = dVar9 * dVar6 - (((dVar8 - dVar7 * dVar10) - dVar10 * dVar6) - dVar7 * dVar9);
  dVar5 = dVar2 * dVar6 - (((dVar11 - dVar7 * dVar5) - dVar5 * dVar6) - dVar7 * dVar2);
  dVar3 = dVar4 - dVar5;
  dVar7 = dVar8 + dVar3;
  dVar8 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar3 - (dVar7 - dVar8));
  dVar2 = dVar8 - dVar11;
  local_118 = (dVar4 - (dVar3 + (dVar4 - dVar3))) + ((dVar4 - dVar3) - dVar5);
  dStack_110 = (dVar8 - (dVar2 + (dVar8 - dVar2))) + ((dVar8 - dVar2) - dVar11);
  dStack_100 = dVar7 + dVar2;
  local_108 = (dVar7 - (dStack_100 - (dStack_100 - dVar7))) + (dVar2 - (dStack_100 - dVar7));
  iVar1 = fast_expansion_sum_zeroelim(4,&local_d8,4,&local_f8,local_58);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_58,4,&local_118,adStack_c0 + 1);
  return adStack_c0[iVar1];
}

Assistant:

REAL orient2dexact(REAL *pa, REAL *pb, REAL *pc)
{
  INEXACT REAL axby1, axcy1, bxcy1, bxay1, cxay1, cxby1;
  REAL axby0, axcy0, bxcy0, bxay0, cxay0, cxby0;
  REAL aterms[4], bterms[4], cterms[4];
  INEXACT REAL aterms3, bterms3, cterms3;
  REAL v[8], w[12];
  int vlength, wlength;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Two_Diff(axby1, axby0, axcy1, axcy0,
               aterms3, aterms[2], aterms[1], aterms[0]);
  aterms[3] = aterms3;

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(bxcy1, bxcy0, bxay1, bxay0,
               bterms3, bterms[2], bterms[1], bterms[0]);
  bterms[3] = bterms3;

  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(cxay1, cxay0, cxby1, cxby0,
               cterms3, cterms[2], cterms[1], cterms[0]);
  cterms[3] = cterms3;

  vlength = fast_expansion_sum_zeroelim(4, aterms, 4, bterms, v);
  wlength = fast_expansion_sum_zeroelim(vlength, v, 4, cterms, w);

  return w[wlength - 1];
}